

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O2

void __thiscall cmCTestSubmitHandler::cmCTestSubmitHandler(cmCTestSubmitHandler *this)

{
  _Rb_tree_header *p_Var1;
  
  cmCTestGenericHandler::cmCTestGenericHandler(&this->super_cmCTestGenericHandler);
  (this->super_cmCTestGenericHandler)._vptr_cmCTestGenericHandler =
       (_func_int **)&PTR_PopulateCustomVectors_00a9c518;
  (this->HTTPProxy)._M_dataplus._M_p = (pointer)&(this->HTTPProxy).field_2;
  (this->HTTPProxy)._M_string_length = 0;
  (this->HTTPProxy).field_2._M_local_buf[0] = '\0';
  (this->HTTPProxyAuth)._M_dataplus._M_p = (pointer)&(this->HTTPProxyAuth).field_2;
  (this->HTTPProxyAuth)._M_string_length = 0;
  (this->HTTPProxyAuth).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->Files)._M_t._M_impl.super__Rb_tree_header;
  (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Files)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Files)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->CommandLineHttpHeaders).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CommandLineHttpHeaders).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CommandLineHttpHeaders).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->HttpHeaders).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->HttpHeaders).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->HttpHeaders).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Initialize(this);
  return;
}

Assistant:

cmCTestSubmitHandler::cmCTestSubmitHandler()
{
  this->Initialize();
}